

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autograd.h
# Opt level: O1

void __thiscall yyml::nn::Autograd<double>::~Autograd(Autograd<double> *this)

{
  _Manager_type p_Var1;
  pointer ppAVar2;
  
  p_Var1 = (this->backward_fn).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->backward_fn,(_Any_data *)&this->backward_fn,__destroy_functor);
  }
  ppAVar2 = (this->next).
            super__Vector_base<yyml::nn::Autograd<double>_*,_std::allocator<yyml::nn::Autograd<double>_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppAVar2 != (pointer)0x0) {
    operator_delete(ppAVar2,(long)(this->next).
                                  super__Vector_base<yyml::nn::Autograd<double>_*,_std::allocator<yyml::nn::Autograd<double>_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppAVar2
                   );
    return;
  }
  return;
}

Assistant:

Autograd(std::vector<Autograd*> next, Variable<Type>* variable_ptr,
           BackwardFunction<Type> backward_fn)
      : next(next), variable_ptr(variable_ptr), backward_fn(backward_fn) {}